

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo-server.c
# Opt level: O3

void after_write(uv_write_t *req,int status)

{
  int iVar1;
  uv_handle_t *handle;
  
  if (status == 0) {
    free(req);
    after_write_cb_called = after_write_cb_called + 1;
    return;
  }
  handle = (uv_handle_t *)(ulong)(uint)status;
  after_write_cold_1();
  iVar1 = uv_is_closing(handle);
  if (iVar1 != 0) {
    return;
  }
  uv_close(handle,(uv_close_cb)0x0);
  return;
}

Assistant:

static void after_write(uv_write_t* req, int status) {
  write_req_t* wr;

  /* Free the read/write buffer and the request */
  wr = (write_req_t*) req;
  free(wr->buf.base);
  free(wr);

  if (status == 0)
    return;

  fprintf(stderr,
          "uv_write error: %s - %s\n",
          uv_err_name(status),
          uv_strerror(status));
}